

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O2

void translate(quadtype nextquad)

{
  quadtype nextquad_00;
  quadtype nextquad_01;
  undefined1 in_stack_00000024 [24];
  
  switch(nextquad.opcode) {
  case opadd:
    transadd(nextquad);
    return;
  case opsub:
    transsub(nextquad);
    return;
  case opneg:
    transneg(nextquad);
    return;
  case opmult:
    transmult(nextquad);
    return;
  case opdiv:
    transdiv(nextquad);
    return;
  case opassn:
    transassn(nextquad);
    return;
  case oparg:
    transarg(nextquad);
    return;
  case opjump:
    nextquad_01._4_24_ = in_stack_00000024;
    nextquad_01.opcode = nextquad.op3.opnd;
    transjump(nextquad_01);
    return;
  case opifposzjump:
  case opifposjump:
  case opifnegzjump:
  case opifnegjump:
  case opifzjump:
  case opifnzjump:
    transifjump(nextquad);
    return;
  case oplabel:
    nextquad_00._4_24_ = in_stack_00000024;
    nextquad_00.opcode = nextquad.op3.opnd;
    translabel(nextquad_00);
    return;
  default:
    return;
  case opproc:
    transproc(nextquad);
    return;
  case opread:
    transread(nextquad);
    return;
  case opwrite:
    transwrite(nextquad);
    return;
  }
}

Assistant:

void    translate(struct quadtype nextquad)
{
    switch(nextquad.opcode)    {
        case opadd:        transadd(nextquad);  break;
        case opsub:        transsub(nextquad);  break;
        case opneg:        transneg(nextquad);  break;
        case opmult:        transmult(nextquad); break;
        case opdiv:        transdiv(nextquad); break;
        case opassn:      transassn(nextquad);  break;
        case opjump:        transjump(nextquad); break;
        case opifposzjump:
        case opifposjump:
        case opifnegzjump:
        case opifnegjump:
        case opifzjump:
        case opifnzjump:    transifjump(nextquad); break;
            
        case oplabel:        translabel(nextquad); break;
        case opread:        transread(nextquad); break;
        case opwrite:        transwrite(nextquad); break;
        case oparg:        transarg(nextquad); break;
        case opproc:        transproc(nextquad); break;
        default: break;
    }
}